

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::TriangleMi<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FastAllocator *this_00;
  ThreadLocal *pTVar9;
  ThreadLocal2 *this_01;
  iterator __position;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  undefined4 uVar16;
  range<unsigned_int> *prVar17;
  size_t sVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  size_t __n;
  size_t i;
  ulong uVar25;
  char *pcVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  undefined1 auVar31 [16];
  vuint4 vgeomID;
  vuint4 v0;
  vuint4 v1;
  vuint4 v2;
  vuint4 vprimID;
  undefined8 local_c8;
  undefined4 auStack_c0 [2];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ulong local_80;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_78;
  undefined1 local_68 [16];
  uint local_58 [6];
  range<unsigned_int> *local_40;
  NodeRecord *local_38;
  
  local_68._8_8_ = local_68._0_8_;
  local_68._0_8_ = this;
  uVar19 = current->_begin;
  local_78.m128[0] = (float)current->_end;
  this_00 = alloc->alloc;
  pTVar9 = alloc->talloc1;
  local_c8 = 0x50;
  this_01 = pTVar9->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_a8[8] = 1;
    local_a8._0_8_ = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_98._0_8_ = this_01;
    local_b8[8] = 1;
    local_b8._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)local_98);
    }
    else {
      *__position._M_current = this_01;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_a8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_a8._0_8_);
    }
  }
  uVar15 = local_c8;
  local_80 = (ulong)(local_78._0_4_ - uVar19);
  pTVar9->bytesUsed = pTVar9->bytesUsed + local_c8;
  sVar18 = pTVar9->cur;
  uVar20 = (ulong)(-(int)sVar18 & 0xf);
  uVar25 = sVar18 + local_c8 + uVar20;
  pTVar9->cur = uVar25;
  local_38 = __return_storage_ptr__;
  if (pTVar9->end < uVar25) {
    pTVar9->cur = sVar18;
    uVar20 = pTVar9->allocBlockSize;
    if (local_c8 * 4 < uVar20 || local_c8 * 4 - uVar20 == 0) {
      local_b8._0_8_ = uVar20;
      pcVar26 = (char *)FastAllocator::malloc(this_00,(size_t)local_b8);
      pTVar9->ptr = pcVar26;
      sVar18 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
      pTVar9->bytesWasted = sVar18;
      pTVar9->end = local_b8._0_8_;
      pTVar9->cur = uVar15;
      if ((ulong)local_b8._0_8_ < uVar15) {
        pTVar9->cur = 0;
        local_b8._0_8_ = pTVar9->allocBlockSize;
        pcVar26 = (char *)FastAllocator::malloc(this_00,(size_t)local_b8);
        pTVar9->ptr = pcVar26;
        sVar18 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
        pTVar9->bytesWasted = sVar18;
        pTVar9->end = local_b8._0_8_;
        pTVar9->cur = uVar15;
        if ((ulong)local_b8._0_8_ < uVar15) {
          pTVar9->cur = 0;
          pcVar26 = (char *)0x0;
          goto LAB_00be45ef;
        }
      }
      pTVar9->bytesWasted = sVar18;
    }
    else {
      pcVar26 = (char *)FastAllocator::malloc(this_00,(size_t)&local_c8);
    }
  }
  else {
    pTVar9->bytesWasted = pTVar9->bytesWasted + uVar20;
    pcVar26 = pTVar9->ptr + (uVar25 - local_c8);
  }
LAB_00be45ef:
  local_b8 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_c8 = 0xffffffffffffffff;
  auStack_c0[0] = 0xffffffff;
  auStack_c0[1] = 0xffffffff;
  local_58[0] = 0xffffffff;
  local_58[1] = 0xffffffff;
  local_58[2] = 0xffffffff;
  local_58[3] = 0xffffffff;
  bVar27 = local_78._0_4_ != uVar19;
  local_78 = _DAT_01f7aa00;
  auVar29 = _DAT_01f7a9f0;
  local_40 = current;
  if (bVar27) {
    lVar10 = *(long *)local_68._0_8_;
    lVar11 = *(long *)(local_68._0_8_ + 8);
    lVar12 = *(long *)(lVar10 + 0x58);
    lVar13 = *(long *)(lVar10 + 0x68);
    lVar14 = *(long *)(lVar10 + 0x90);
    uVar15 = *(ulong *)(lVar10 + 0xa0);
    lVar10 = *(long *)(local_68._0_8_ + 0x10);
    uVar21 = (uint)(uVar15 >> 2) & 0x3fffffff;
    lVar22 = local_80 + (local_80 == 0);
    lVar23 = 0;
    aVar30 = _DAT_01f7aa00;
    do {
      uVar5 = *(uint *)(lVar11 + (ulong)uVar19 * 8 + 4 + lVar23 * 2);
      lVar24 = (ulong)uVar5 * lVar13;
      uVar6 = *(uint *)(lVar12 + lVar24);
      uVar7 = *(uint *)(lVar12 + 4 + lVar24);
      auVar28 = *(undefined1 (*) [16])(lVar14 + uVar6 * uVar15);
      auVar3 = *(undefined1 (*) [16])(lVar14 + uVar7 * uVar15);
      uVar8 = *(uint *)(lVar12 + 8 + lVar24);
      auVar4 = *(undefined1 (*) [16])(lVar14 + uVar8 * uVar15);
      auVar31 = minps(auVar29,auVar28);
      auVar29 = minps(auVar3,auVar4);
      auVar29 = minps(auVar31,auVar29);
      auVar31 = maxps((undefined1  [16])aVar30,auVar28);
      auVar28 = maxps(auVar3,auVar4);
      aVar30 = (anon_union_16_2_47237d3f_for_Vec3fx_0)maxps(auVar31,auVar28);
      *(int *)((long)&local_c8 + lVar23) = (int)lVar10;
      *(uint *)((long)local_58 + lVar23) = uVar5;
      *(uint *)(local_b8 + lVar23) = uVar21 * uVar6;
      *(uint *)(local_a8 + lVar23) = uVar7 * uVar21;
      *(uint *)(local_98 + lVar23) = uVar8 * uVar21;
      lVar23 = lVar23 + 4;
      local_78 = aVar30;
    } while (lVar22 * 4 != lVar23);
  }
  prVar17 = local_40;
  uVar15 = local_80;
  local_68._0_12_ = auVar29._0_12_;
  uVar19 = (uint)local_80;
  if (uVar19 < 4) {
    __n = local_80 * -4 + 0x10;
    local_68 = auVar29;
    memset(local_58 + local_80,0xff,__n);
    memset(local_b8 + uVar15 * 4,0,__n);
    memset(local_a8 + uVar15 * 4,0,__n);
    memset(local_98 + uVar15 * 4,0,__n);
    uVar16 = (undefined4)local_c8;
    uVar19 = 3 - uVar19;
    *(undefined4 *)((long)&local_c8 + uVar15 * 4) = (undefined4)local_c8;
    uVar21 = uVar19 ^ 0x80000000;
    if (-0x80000000 < (int)uVar21) {
      *(undefined4 *)((long)&local_c8 + uVar15 * 4 + 4) = uVar16;
    }
    if (-0x7fffffff < (int)(uVar19 ^ 0x80000000)) {
      auStack_c0[uVar15] = uVar16;
    }
    if (-0x7ffffffe < (int)uVar21) {
      *(undefined4 *)(local_b8 + uVar15 * 4 + -4) = uVar16;
    }
  }
  *(undefined8 *)pcVar26 = local_b8._0_8_;
  *(undefined8 *)(pcVar26 + 8) = local_b8._8_8_;
  *(undefined8 *)(pcVar26 + 0x10) = local_a8._0_8_;
  *(undefined8 *)(pcVar26 + 0x18) = local_a8._8_8_;
  *(undefined8 *)(pcVar26 + 0x20) = local_98._0_8_;
  *(undefined8 *)(pcVar26 + 0x28) = local_98._8_8_;
  *(ulong *)(pcVar26 + 0x30) = local_c8;
  *(ulong *)(pcVar26 + 0x38) = CONCAT44(auStack_c0[1],auStack_c0[0]);
  *(ulong *)(pcVar26 + 0x40) = CONCAT44(local_58[1],local_58[0]);
  *(ulong *)(pcVar26 + 0x48) = CONCAT44(local_58[3],local_58[2]);
  aVar30.m128[3] = (float)(prVar17->_end - prVar17->_begin);
  aVar30._0_12_ = local_68._0_12_;
  (local_38->ref).ptr = (ulong)pcVar26 | 9;
  (local_38->bounds).lower.field_0 = aVar30;
  (local_38->bounds).upper.field_0 = local_78;
  return local_38;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4i* accel = (Triangle4i*) alloc.malloc1(sizeof(Triangle4i),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        
        vuint4 v0 = zero, v1 = zero, v2 = zero;
        vuint4 vgeomID = -1, vprimID = -1;
        const TriangleMesh* __restrict__ const mesh = this->mesh;
        
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID[i] = geomID_;
          vprimID[i] = primID;
          unsigned int int_stride = mesh->vertices0.getStride()/4;
          v0[i] = tri.v[0] * int_stride; 
          v1[i] = tri.v[1] * int_stride;
          v2[i] = tri.v[2] * int_stride;
        }
        
        for (size_t i=items; i<4; i++)
        {
          vgeomID[i] = vgeomID[0];
          vprimID[i] = -1;
          v0[i] = 0;
          v1[i] = 0; 
          v2[i] = 0;
        }
        Triangle4i::store_nt(accel,Triangle4i(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }